

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

problem * __thiscall
anon_unknown.dwarf_ccf27::preprocessor<baryonyx::problem>::operator()
          (problem *__return_storage_ptr__,preprocessor<baryonyx::problem> *this,int variable_index,
          bool variable_value)

{
  context *ctx;
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  baryonyx local_58 [16];
  string local_48;
  size_type local_28;
  byte local_1d;
  int local_1c;
  bool variable_value_local;
  preprocessor<baryonyx::problem> *ppStack_18;
  int variable_index_local;
  preprocessor<baryonyx::problem> *this_local;
  
  local_1d = variable_value;
  local_1c = variable_index;
  ppStack_18 = this;
  this_local = (preprocessor<baryonyx::problem> *)__return_storage_ptr__;
  std::
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::clear(&this->vars);
  pp_lifo::clear(&this->lifo);
  init_constraints_length_container(this);
  affect_variable(this,local_1c,(bool)(local_1d & 1));
  affects(this);
  make_lp_from_bqp_objective(this);
  try_remove_unused_variable(this);
  affects(this);
  ctx = this->ctx;
  local_28 = std::
             unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
             ::size(&this->vars);
  size = baryonyx::memory_consumed(this->pb);
  baryonyx::memory_consumed_size<unsigned_long>(local_58,size);
  baryonyx::to_string_abi_cxx11_(&local_48,local_58,mem);
  baryonyx::info<unsigned_long,std::__cxx11::string>
            (ctx,"  - Preprocessor finish. Removed variables {} (size: {})\n",&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  make_problem(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

bx::problem operator()(int variable_index, bool variable_value)
    {
        vars.clear();
        lifo.clear();
        init_constraints_length_container();

        affect_variable(variable_index, variable_value);
        affects();

        make_lp_from_bqp_objective();
        try_remove_unused_variable();
        affects();

        info(ctx,
             "  - Preprocessor finish. Removed variables {} (size: {})\n",
             vars.size(),
             to_string(bx::memory_consumed_size(memory_consumed(pb))));

        return make_problem();
    }